

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O0

regexp_flag mjs::regexp_flag_from_char(char ch)

{
  undefined4 local_c;
  char ch_local;
  
  if (ch == 'g') {
    local_c = global;
  }
  else if (ch == 'i') {
    local_c = ignore_case;
  }
  else if (ch == 'm') {
    local_c = multiline;
  }
  else {
    local_c = none;
  }
  return local_c;
}

Assistant:

regexp_flag regexp_flag_from_char(char ch) {
    switch (ch) {
    case 'g': return regexp_flag::global;
    case 'i': return regexp_flag::ignore_case;
    case 'm': return regexp_flag::multiline;
    default:  return regexp_flag::none;
    }
}